

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O2

void getter_thread_body(void *arg)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_240;
  char buffer [512];
  
  do {
    iVar1 = uv_get_process_title(buffer,0x200);
    if (iVar1 != 0) {
      pcVar2 = "0 == uv_get_process_title(buffer, sizeof(buffer))";
      uStack_240 = 0x2d;
LAB_00144ffe:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,uStack_240,pcVar2);
      abort();
    }
    iVar1 = bcmp(buffer,"8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled"
                 ,0x4b);
    if (iVar1 != 0) {
      iVar1 = bcmp(buffer,
                   "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82",0x4b
                  );
      if (iVar1 != 0) {
        iVar1 = bcmp(buffer,
                     "9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT",
                     0x4b);
        if (iVar1 != 0) {
          iVar1 = bcmp(buffer,
                       "n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU",
                       0x4b);
          if (iVar1 != 0) {
            pcVar2 = 
            "0 == strcmp(buffer, titles[0]) || 0 == strcmp(buffer, titles[1]) || 0 == strcmp(buffer, titles[2]) || 0 == strcmp(buffer, titles[3])"
            ;
            uStack_240 = 0x32;
            goto LAB_00144ffe;
          }
        }
      }
    }
    uv_sleep(0);
  } while( true );
}

Assistant:

static void getter_thread_body(void* arg) {
  char buffer[512];

  for (;;) {
    ASSERT(0 == uv_get_process_title(buffer, sizeof(buffer)));
    ASSERT(
      0 == strcmp(buffer, titles[0]) ||
      0 == strcmp(buffer, titles[1]) ||
      0 == strcmp(buffer, titles[2]) ||
      0 == strcmp(buffer, titles[3]));

    uv_sleep(0);
  }
}